

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

float Abc_BufComputeDep(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  float local_2c;
  
  local_2c = -1e+09;
  for (lVar3 = 0; lVar3 < (pObj->vFanouts).nSize; lVar3 = lVar3 + 1) {
    pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]];
    iVar1 = Vec_IntEntry(p->vOffsets,pObj_00->Id);
    if (iVar1 != -1000000000) {
      iVar1 = Abc_BufNodeDep(p,pObj_00);
      iVar2 = Abc_NodeFindFanin(pObj_00,pObj);
      iVar2 = Abc_BufEdgeDelay(p,pObj_00,iVar2);
      if (local_2c < (float)(iVar2 + iVar1)) {
        local_2c = (float)(iVar2 + iVar1);
      }
    }
  }
  Vec_IntWriteEntry(p->vDep,pObj->Id,(int)local_2c);
  return local_2c;
}

Assistant:

float Abc_BufComputeDep( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pFanout)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeDep(p, pFanout) + Abc_BufEdgeDelay(p, pFanout, Abc_NodeFindFanin(pFanout, pObj));
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeDep( p, pObj, Delay );
    return Delay;
}